

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkym(fitsfile *fptr,char *keyname,double *value,char *comm,int *status)

{
  size_t sVar1;
  char local_e8 [4];
  int len;
  char message [81];
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  double *value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    ffgkey(fptr,keyname,local_88,comm,status);
    if (local_88[0] == '(') {
      local_88[0] = ' ';
      sVar1 = strcspn(local_88,")");
      local_88[(int)sVar1] = '\0';
      sVar1 = strcspn(local_88,",");
      local_88[(int)sVar1] = '\0';
      ffc2d(local_88,value,status);
      ffc2d(local_88 + ((int)sVar1 + 1),value + 1,status);
      fptr_local._4_4_ = *status;
    }
    else {
      snprintf(local_e8,0x51,"keyword %s does not have a complex value (ffgkym):",keyname);
      ffpmsg(local_e8);
      ffpmsg(local_88);
      *status = 0x199;
      fptr_local._4_4_ = 0x199;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgkym( fitsfile *fptr,     /* I - FITS file pointer         */
            const char  *keyname,     /* I - name of keyword to read   */
            double *value,      /* O - keyword value (real,imag) */
            char  *comm,        /* O - keyword comment           */
            int   *status)      /* IO - error status             */
/*
  Read (get) the named keyword, returning the value and comment.
  The keyword must have a complex value. No implicit data conversion
  will be performed.
*/
{
    char valstring[FLEN_VALUE], message[FLEN_ERRMSG];
    int len;

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */

    if (valstring[0] != '(' )   /* test that this is a complex keyword */
    {
      snprintf(message, FLEN_ERRMSG, "keyword %s does not have a complex value (ffgkym):",
              keyname);
      ffpmsg(message);
      ffpmsg(valstring);
      return(*status = BAD_C2D);
    }

    valstring[0] = ' ';            /* delete the opening parenthesis */
    len = strcspn(valstring, ")" );  
    valstring[len] = '\0';         /* delete the closing parenthesis */

    len = strcspn(valstring, ",");
    valstring[len] = '\0';

    ffc2d(valstring, &value[0], status);        /* convert the real part */
    ffc2d(&valstring[len + 1], &value[1], status);  /* convert the imag. part */

    return(*status);
}